

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O3

void FILEDosToUnixPathA(LPSTR lpPath)

{
  char cVar1;
  size_t sVar2;
  CHAR CVar3;
  LPSTR __s;
  LPSTR pCVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpPath == (LPSTR)0x0) {
      return;
    }
    pCVar4 = (LPSTR)0x0;
    CVar3 = '\0';
    __s = lpPath;
    do {
      cVar1 = *__s;
      if (cVar1 == '\\') {
        *__s = '/';
        if (pCVar4 != (LPSTR)0x0) {
joined_r0x0032da74:
          if ((byte)(CVar3 - 0x30U) < 0xfe) {
            sVar2 = strlen(__s);
            memmove(pCVar4,__s,sVar2 + 1);
            __s = pCVar4;
          }
        }
LAB_0032dad7:
        pCVar4 = (LPSTR)0x0;
      }
      else {
        if (cVar1 == '\0') goto LAB_0032daea;
        if (pCVar4 == (LPSTR)0x0) {
          if (cVar1 == '.') {
            pCVar4 = __s;
            if (__s == lpPath) {
              CVar3 = *lpPath;
            }
            else {
              CVar3 = __s[-1];
            }
            goto LAB_0032dada;
          }
          goto LAB_0032dad7;
        }
        if (cVar1 == '*') {
          if (2 < (long)__s - (long)lpPath) {
            if ((__s[-2] == '*') && (__s[-1] == '.')) {
              sVar2 = strlen(__s);
              memmove(__s + -2,__s,sVar2 + 1);
            }
            goto LAB_0032dad7;
          }
        }
        else if (cVar1 != '.') {
          if (cVar1 == '/') goto joined_r0x0032da74;
          goto LAB_0032dad7;
        }
      }
LAB_0032dada:
      __s = __s + 1;
    } while( true );
  }
LAB_0032db1b:
  abort();
LAB_0032daea:
  if ((pCVar4 != lpPath && pCVar4 != (LPSTR)0x0) && (pCVar4[-1] != '/')) {
    *pCVar4 = '\0';
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return;
  }
  goto LAB_0032db1b;
}

Assistant:

void
FILEDosToUnixPathA(
       LPSTR lpPath)
{
    LPSTR p;
    LPSTR pPointAtDot=NULL;
    char charBeforeFirstDot='\0';

    TRACE("Original DOS path = [%s]\n", lpPath);

    if (!lpPath)
    {
        return;
    }

    for (p = lpPath; *p; p++)
    {
        /* Make the \\ to / switch first */
        if (*p == '\\')
        {
            /* Replace \ with / */
            *p = '/';
        }

        if (pPointAtDot)
        {
            /* If pPointAtDot is not NULL, it is pointing at the first encountered
               dot.  If we encountered a \, that means it could be a trailing dot */
            if (*p == '/')
            {
                /* If char before the first dot is a '\' or '.' (special case if the
                   dot is the first char in the path) , then we leave it alone,
                   because it is either . or .., otherwise it is a trailing dot
                   pattern and will be truncated */
                if (charBeforeFirstDot != '.' && charBeforeFirstDot != '/')
                {
                    memmove(pPointAtDot,p,(strlen(p)*sizeof(char))+1);
                    p = pPointAtDot;
                }
                pPointAtDot = NULL; /* Need to reset this */
            }
            else if (*p == '*')
            {
                /* Check our size before doing anything with our pointers */
                if ((p - lpPath) >= 3)
                {
                    /* At this point, we know that there is 1 or more dots and
                       then a star.  AND we know the size of our string at this
                       point is at least 3 (so we can go backwards from our pointer
                       safely AND there could possilby be two characters back)
                       So lets check if there is a '*' and a '.' before, if there
                       is, replace just a '*'.  Otherwise, reset pPointAtDot to NULL
                       and do nothing */
                    if (p[-2] == '*' &&
                        p[-1] == '.' &&
                        p[0] == '*')
                    {
                        memmove(&(p[-2]),p,(strlen(p)*sizeof(char))+1);
                    }

                    pPointAtDot  = NULL;
                }
            }
            else if (*p != '.')
            {
                /* If we are here, that means that this is NOT a trailing dot,
                   some other character is here, so forget our pointer */
                pPointAtDot = NULL;
            }
        }
        else
        {
            if (*p == '.')
            {
                /* If pPointAtDot is NULL, and we encounter a dot, save the pointer */
                pPointAtDot = p;
                if (pPointAtDot != lpPath)
                {
                    charBeforeFirstDot = p[-1];
                }
                else
                {
                    charBeforeFirstDot = lpPath[0];
                }
            }
        }
    }

    /* If pPointAtDot still points at anything, then we still have trailing dots.
       Truncate at pPointAtDot, unless the dots are path specifiers (. or ..) */
    if (pPointAtDot)
    {
        /* make sure the trailing dots don't follow a '/', and that they aren't
           the only thing in the name */
        if(pPointAtDot != lpPath && *(pPointAtDot-1) != '/')
        {
            *pPointAtDot = '\0';
        }
    }

    TRACE("Resulting Unix path = [%s]\n", lpPath);
}